

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::JavascriptRegExp::GetPropertyQuery
          (JavascriptRegExp *this,Var originalInstance,JavascriptString *propertyNameString,
          Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  bool bVar1;
  PropertyQueryFlags PVar2;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  PropertyValueInfo *local_40;
  int local_34 [2];
  BOOL result;
  
  propertyRecord = (PropertyRecord *)requestContext;
  local_40 = info;
  ScriptContext::FindPropertyRecord
            ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_50);
  if ((local_50 != (PropertyRecord *)0x0) &&
     (bVar1 = GetPropertyBuiltIns(this,local_50->pid,value,local_34), bVar1)) {
    return (uint)(local_34[0] != 0);
  }
  PVar2 = DynamicObject::GetPropertyQuery
                    (&this->super_DynamicObject,originalInstance,propertyNameString,value,local_40,
                     (ScriptContext *)propertyRecord);
  return PVar2;
}

Assistant:

PropertyQueryFlags JavascriptRegExp::GetPropertyQuery(Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        BOOL result;
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr && GetPropertyBuiltIns(propertyRecord->GetPropertyId(), value, &result))
        {
            return JavascriptConversion::BooleanToPropertyQueryFlags(result);
        }

        return DynamicObject::GetPropertyQuery(originalInstance, propertyNameString, value, info, requestContext);
    }